

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O1

atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
* __thiscall
gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
          (atomic_guarded<std::__cxx11::string,std::mutex> *this,
          basic_string_view<char,_std::char_traits<char>_> *newObj)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x20));
  if (iVar1 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,0,
               *(size_type *)(this + 8),newObj->_M_str,newObj->_M_len);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x20));
    return (atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
            *)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

atomic_guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }